

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundogroup.cpp
# Opt level: O0

void __thiscall QUndoGroup::addStack(QUndoGroup *this,QUndoStack *stack)

{
  long lVar1;
  bool bVar2;
  QUndoStackPrivate *pQVar3;
  QListSpecialMethodsBase<QUndoStack_*> *in_RDI;
  long in_FS_OFFSET;
  QUndoGroup *other;
  QUndoGroupPrivate *d;
  parameter_type in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QUndoGroup *)0xa886bf);
  bVar2 = QListSpecialMethodsBase<QUndoStack*>::contains<QUndoStack*>
                    (in_RDI,(QUndoStack **)in_stack_ffffffffffffffc8);
  if (!bVar2) {
    QList<QUndoStack_*>::append((QList<QUndoStack_*> *)0xa886f8,in_stack_ffffffffffffffc8);
    pQVar3 = QUndoStack::d_func((QUndoStack *)0xa88702);
    if ((QUndoStack *)pQVar3->group != (QUndoStack *)0x0) {
      removeStack((QUndoGroup *)in_RDI,(QUndoStack *)pQVar3->group);
    }
    pQVar3 = QUndoStack::d_func((QUndoStack *)0xa8872f);
    pQVar3->group = (QUndoGroup *)in_RDI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUndoGroup::addStack(QUndoStack *stack)
{
    Q_D(QUndoGroup);

    if (d->stack_list.contains(stack))
        return;
    d->stack_list.append(stack);

    if (QUndoGroup *other = stack->d_func()->group)
        other->removeStack(stack);
    stack->d_func()->group = this;
}